

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_gvec_op3_fpst(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int rm,_Bool is_fp16,
                      int data,gen_helper_gvec_3_ptr_conflict2 *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t oprsz;
  uint32_t maxsz;
  TCGv_ptr ptr;
  TCGv_ptr fpst;
  TCGContext_conflict1 *tcg_ctx;
  _Bool is_fp16_local;
  int rm_local;
  int rn_local;
  int rd_local;
  _Bool is_q_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ptr = get_fpstatus_ptr_aarch64(tcg_ctx_00,is_fp16);
  dofs = vec_full_reg_offset(s,rd);
  aofs = vec_full_reg_offset(s,rn);
  bofs = vec_full_reg_offset(s,rm);
  oprsz = 8;
  if (is_q) {
    oprsz = 0x10;
  }
  maxsz = vec_full_reg_size(s);
  tcg_gen_gvec_3_ptr_aarch64(tcg_ctx_00,dofs,aofs,bofs,ptr,oprsz,maxsz,data,fn);
  tcg_temp_free_ptr(tcg_ctx_00,ptr);
  return;
}

Assistant:

static void gen_gvec_op3_fpst(DisasContext *s, bool is_q, int rd, int rn,
                              int rm, bool is_fp16, int data,
                              gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, is_fp16);
    tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       vec_full_reg_offset(s, rm), fpst,
                       is_q ? 16 : 8, vec_full_reg_size(s), data, fn);
    tcg_temp_free_ptr(tcg_ctx, fpst);
}